

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robust_deserialization_unit.c
# Opt level: O2

char * readfile(FILE *fp,size_t *bytes)

{
  size_t sVar1;
  char *__ptr;
  
  sVar1 = filesize(fp);
  *bytes = sVar1;
  __ptr = (char *)malloc(sVar1);
  if (__ptr != (char *)0x0) {
    rewind((FILE *)fp);
    sVar1 = fread(__ptr,1,*bytes,(FILE *)fp);
    if (*bytes == sVar1) {
      return __ptr;
    }
    free(__ptr);
  }
  return (char *)0x0;
}

Assistant:

char* readfile(FILE* fp, size_t* bytes) {
    *bytes = filesize(fp);
    char* buf = (char*)malloc(*bytes);
    if (buf == NULL) return NULL;

    rewind(fp);

    size_t cnt = fread(buf, 1, *bytes, fp);
    if (*bytes != cnt) {
        free(buf);
        return NULL;
    }
    return buf;
}